

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

void __thiscall inja::Environment::Environment(Environment *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  Environment(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

Environment(): Environment("") { }